

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O0

_Bool square_changeable(chunk *c,loc_conflict grid)

{
  _Bool _Var1;
  object *local_28;
  object *obj;
  chunk *c_local;
  loc_conflict grid_local;
  
  _Var1 = square_ispermanent(c,grid);
  if (_Var1) {
    grid_local.x._3_1_ = false;
  }
  else {
    for (local_28 = square_object(c,grid); local_28 != (object *)0x0; local_28 = local_28->next) {
      if (local_28->artifact != (artifact *)0x0) {
        return false;
      }
    }
    grid_local.x._3_1_ = true;
  }
  return grid_local.x._3_1_;
}

Assistant:

bool square_changeable(struct chunk *c, struct loc grid)
{
	struct object *obj;

	/* Forbid perma-grids */
	if (square_ispermanent(c, grid))
		return (false);

	/* Check objects */
	for (obj = square_object(c, grid); obj; obj = obj->next)
		/* Forbid artifact grids */
		if (obj->artifact) return (false);

	/* Accept */
	return (true);
}